

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

bool __thiscall Assimp::ASE::Parser::SkipToNextToken(Parser *this)

{
  char in;
  bool bVar1;
  char me;
  Parser *this_local;
  
  while( true ) {
    in = *this->filePtr;
    bVar1 = IsLineEnd<char>(in);
    if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    if (((in == '*') || (in == '}')) || (in == '{')) break;
    if (in == '\0') {
      return false;
    }
    this->filePtr = this->filePtr + 1;
  }
  return true;
}

Assistant:

bool Parser::SkipToNextToken()
{
    while (true)
    {
        char me = *filePtr;

        // increase the line number counter if necessary
        if (IsLineEnd(me) && !bLastWasEndLine)
        {
            ++iLineNumber;
            bLastWasEndLine = true;
        }
        else bLastWasEndLine = false;
        if ('*' == me || '}' == me || '{' == me)return true;
        if ('\0' == me)return false;

        ++filePtr;
    }
}